

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O0

void run_init_quads_task(parallel_task_1d *task,size_t thread_id)

{
  void *__dest;
  quad local_b0;
  vec3 *local_68;
  vec3 *v3;
  vec3 *v2;
  vec3 *v1;
  vec3 *v0;
  size_t n;
  size_t i;
  vec3 *vertices;
  mesh *mesh;
  quad *quads;
  init_primitives_task *init_primitives_task;
  size_t thread_id_local;
  parallel_task_1d *task_local;
  
  mesh = (mesh *)task[1].work_item.work_fn;
  vertices = (vec3 *)task[1].work_item.next;
  i = *(size_t *)(((work_item *)((long)vertices + 0x10))->work_fn + 8);
  v0 = (vec3 *)(task->range).end;
  quads = (quad *)task;
  init_primitives_task = (init_primitives_task *)thread_id;
  thread_id_local = (size_t)task;
  for (n = (task->range).begin; n < v0; n = n + 1) {
    v1 = (vec3 *)(i + *(long *)(*(long *)(vertices->_ + 2) + n * 0x20) * 0xc);
    v2 = (vec3 *)(i + *(long *)(*(long *)(vertices->_ + 2) + 8 + n * 0x20) * 0xc);
    v3 = (vec3 *)(i + *(long *)(*(long *)(vertices->_ + 2) + 0x10 + n * 0x20) * 0xc);
    local_68 = (vec3 *)(i + *(long *)(*(long *)(vertices->_ + 2) + 0x18 + n * 0x20) * 0xc);
    __dest = (void *)((long)mesh + n * 0x48);
    make_quad(&local_b0,v1,v2,v3,local_68);
    memcpy(__dest,&local_b0,0x48);
  }
  return;
}

Assistant:

static void run_init_quads_task(struct parallel_task_1d* task, size_t thread_id) {
    IGNORE(thread_id);
    struct init_primitives_task* init_primitives_task = (void*)task;
    struct quad* quads = init_primitives_task->primitives;
    const struct mesh* mesh = init_primitives_task->mesh;
    const struct vec3* vertices = mesh->attrs[ATTR_POSITION].data;
    for (size_t i = task->range.begin, n = task->range.end; i < n; ++i) {
        const struct vec3* v0 = &vertices[mesh->indices[i * 4 + 0]];
        const struct vec3* v1 = &vertices[mesh->indices[i * 4 + 1]];
        const struct vec3* v2 = &vertices[mesh->indices[i * 4 + 2]];
        const struct vec3* v3 = &vertices[mesh->indices[i * 4 + 3]];
        quads[i] = make_quad(v0, v1, v2, v3);
    }
}